

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseNode_Root(AMFImporter *this)

{
  string *psVar1;
  size_t *psVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  CAMFImporter_NodeElement *pCVar7;
  _List_node_base *p_Var8;
  undefined8 extraout_RAX;
  AMFImporter *this_00;
  pointer pcVar9;
  _Alloc_hider *p_Var10;
  uint uVar11;
  char *__end;
  ulong uVar12;
  string an;
  string version;
  string unit;
  undefined1 local_a0 [40];
  CAMFImporter_NodeElement *local_78;
  _Alloc_hider local_70;
  undefined8 local_68;
  char local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  undefined4 extraout_var_00;
  
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_70._M_p = local_60;
  local_68._0_4_ = M;
  local_68._4_4_ = 0;
  local_60[0] = '\0';
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar12 = 0;
    local_78 = (CAMFImporter_NodeElement *)CONCAT44(local_78._4_4_,uVar4);
    do {
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,uVar12);
      std::__cxx11::string::string
                ((string *)local_a0,(char *)CONCAT44(extraout_var,iVar5),
                 (allocator *)(local_a0 + 0x27));
      iVar5 = std::__cxx11::string::compare((char *)local_a0);
      if (iVar5 == 0) {
        iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar5);
        p_Var10 = &local_50;
LAB_003d5842:
        pcVar3 = p_Var10[1]._M_p;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)p_Var10,0,pcVar3,(ulong)__s);
        uVar4 = (uint)local_78;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)local_a0);
        if (iVar5 == 0) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_00,iVar5);
          p_Var10 = &local_70;
          goto LAB_003d5842;
        }
      }
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar4 != uVar11);
  }
  if ((this->mUnit)._M_string_length != 0) {
    psVar1 = &this->mUnit;
    iVar5 = std::__cxx11::string::compare((char *)psVar1);
    if ((((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
        (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)) &&
       ((iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0 &&
        (iVar5 = std::__cxx11::string::compare((char *)psVar1), iVar5 != 0)))) goto LAB_003d5cdf;
  }
  pCVar7 = (CAMFImporter_NodeElement *)operator_new(0x90);
  pCVar7->Type = 9;
  (pCVar7->ID)._M_dataplus._M_p = (pointer)&(pCVar7->ID).field_2;
  (pCVar7->ID)._M_string_length = 0;
  (pCVar7->ID).field_2._M_local_buf[0] = '\0';
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pCVar7->Parent = (CAMFImporter_NodeElement *)0x0;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pCVar7->Child;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pCVar7->Child;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pCVar7->_vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_Root_0081f448;
  pCVar7[1]._vptr_CAMFImporter_NodeElement = (_func_int **)&pCVar7[1].ID;
  *(_List_node_base **)&pCVar7[1].Type = (_List_node_base *)0x0;
  *(undefined1 *)&pCVar7[1].ID._M_dataplus._M_p = 0;
  pCVar7[1].ID.field_2._M_allocated_capacity = (size_type)&pCVar7[1].Parent;
  *(undefined8 *)((long)&pCVar7[1].ID.field_2 + 8) = 0;
  *(undefined1 *)&pCVar7[1].Parent = 0;
  this->mNodeElement_Cur = pCVar7;
  std::__cxx11::string::_M_assign((string *)(pCVar7 + 1));
  std::__cxx11::string::_M_assign((string *)pCVar7[1].ID.field_2._M_local_buf);
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar5 == '\0') {
    local_78 = pCVar7;
    do {
      do {
        while( true ) {
          pcVar9 = local_a0 + 0x10;
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar5 == '\0') goto LAB_003d5cba;
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar6 != 1) break;
          local_a0._0_8_ = pcVar9;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"object","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)local_a0);
          if ((pointer)local_a0._0_8_ != pcVar9) {
            operator_delete((void *)local_a0._0_8_);
          }
          if (iVar5 == 0) {
            ParseNode_Object(this);
          }
          else {
            local_a0._0_8_ = pcVar9;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"material","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)local_a0);
            if ((pointer)local_a0._0_8_ != pcVar9) {
              operator_delete((void *)local_a0._0_8_);
            }
            if (iVar5 == 0) {
              ParseNode_Material(this);
            }
            else {
              local_a0._0_8_ = pcVar9;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"texture","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)local_a0);
              if ((pointer)local_a0._0_8_ != pcVar9) {
                operator_delete((void *)local_a0._0_8_);
              }
              if (iVar5 == 0) {
                ParseNode_Texture(this);
              }
              else {
                local_a0._0_8_ = pcVar9;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,"constellation","");
                (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar5 = std::__cxx11::string::compare((char *)local_a0);
                if ((pointer)local_a0._0_8_ != pcVar9) {
                  operator_delete((void *)local_a0._0_8_);
                }
                if (iVar5 == 0) {
                  ParseNode_Constellation(this);
                }
                else {
                  local_a0._0_8_ = pcVar9;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"metadata","");
                  (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar5 = std::__cxx11::string::compare((char *)local_a0);
                  if ((pointer)local_a0._0_8_ != pcVar9) {
                    operator_delete((void *)local_a0._0_8_);
                  }
                  if (iVar5 == 0) {
                    ParseNode_Metadata(this);
                  }
                  else {
                    local_a0._0_8_ = pcVar9;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"amf","");
                    XML_CheckNode_SkipUnsupported(this,(string *)local_a0);
                    if ((pointer)local_a0._0_8_ != pcVar9) {
                      operator_delete((void *)local_a0._0_8_);
                    }
                  }
                }
              }
            }
          }
        }
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar6 != 2);
      local_a0._0_8_ = pcVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"amf","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar6 = std::__cxx11::string::compare((char *)local_a0);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_);
      }
    } while (iVar6 != 0);
    if ((char)iVar5 == '\0') {
LAB_003d5cba:
      local_a0._0_8_ = local_a0 + 0x10;
      this_00 = (AMFImporter *)local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"amf","");
      Throw_CloseNotFound(this_00,(string *)local_a0);
LAB_003d5cdf:
      local_a0._0_8_ = local_a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"unit","");
      Throw_IncorrectAttrValue(this,(string *)local_a0);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_);
      }
      if (local_70._M_p != local_60) {
        operator_delete(local_70._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p);
      }
      _Unwind_Resume(extraout_RAX);
    }
    this->mNodeElement_Cur = local_78;
    pCVar7 = local_78;
  }
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = (_List_node_base *)pCVar7;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar2 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Root()
{
    std::string unit, version;
    CAMFImporter_NodeElement *ne( nullptr );

	// Read attributes for node <amf>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("unit", unit, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("version", version, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND_WSKIP;

	// Check attributes
	if(!mUnit.empty())
	{
		if((mUnit != "inch") && (mUnit != "millimeter") && (mUnit != "meter") && (mUnit != "feet") && (mUnit != "micron")) Throw_IncorrectAttrValue("unit");
	}

	// create root node element.
	ne = new CAMFImporter_NodeElement_Root(nullptr);
	mNodeElement_Cur = ne;// set first "current" element
	// and assign attribute's values
	((CAMFImporter_NodeElement_Root*)ne)->Unit = unit;
	((CAMFImporter_NodeElement_Root*)ne)->Version = version;

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		MACRO_NODECHECK_LOOPBEGIN("amf");
			if(XML_CheckNode_NameEqual("object")) { ParseNode_Object(); continue; }
			if(XML_CheckNode_NameEqual("material")) { ParseNode_Material(); continue; }
			if(XML_CheckNode_NameEqual("texture")) { ParseNode_Texture(); continue; }
			if(XML_CheckNode_NameEqual("constellation")) { ParseNode_Constellation(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("amf");
		mNodeElement_Cur = ne;// force restore "current" element
	}// if(!mReader->isEmptyElement())

	mNodeElement_List.push_back(ne);// add to node element list because its a new object in graph.
}